

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_neon_addl_saturate(TCGContext_conflict1 *tcg_ctx,TCGv_i64 op0,TCGv_i64 op1,int size)

{
  int size_local;
  TCGv_i64 op1_local;
  TCGv_i64 op0_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  if (size == 1) {
    gen_helper_neon_addl_saturate_s32(tcg_ctx,op0,tcg_ctx->cpu_env,op0,op1);
  }
  else {
    if (size != 2) {
      abort();
    }
    gen_helper_neon_addl_saturate_s64(tcg_ctx,op0,tcg_ctx->cpu_env,op0,op1);
  }
  return;
}

Assistant:

static inline void gen_neon_addl_saturate(TCGContext *tcg_ctx, TCGv_i64 op0, TCGv_i64 op1, int size)
{
    switch (size) {
    case 1: gen_helper_neon_addl_saturate_s32(tcg_ctx, op0, tcg_ctx->cpu_env, op0, op1); break;
    case 2: gen_helper_neon_addl_saturate_s64(tcg_ctx, op0, tcg_ctx->cpu_env, op0, op1); break;
    default: abort();
    }
}